

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O3

void __thiscall dlib::timer<dlib::image_display>::clear(timer<dlib::image_display> *this)

{
  auto_mutex M;
  auto_mutex local_20;
  
  local_20.m = &((this->gc).super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->m;
  local_20.r = (rmutex *)0x0;
  local_20.rw = (read_write_mutex *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)local_20.m);
  (this->super_timer_base).running = false;
  timer_global_clock::remove
            ((this->gc).super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(char *)this);
  (this->super_timer_base).delay = 1000;
  (this->super_timer_base).next_time_to_run = 0;
  auto_mutex::unlock(&local_20);
  return;
}

Assistant:

void timer<T>::
    clear(
    )
    {
        auto_mutex M(gc->m);
        running = false;
        gc->remove(this);
        delay = 1000;        
        next_time_to_run = 0;
    }